

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelfadjointProduct.h
# Opt level: O1

void Eigen::
     selfadjoint_product_selector<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_1,_false>
     ::run(Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *mat,
          Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false> *other,Scalar *alpha)

{
  RhsScalar *size;
  long depth;
  double *_lhs;
  long lhsStride;
  RhsScalar *local_80;
  Index n;
  BlockingType blocking;
  Scalar local_38;
  Scalar actualAlpha;
  
  local_38 = *alpha;
  size = (RhsScalar *)
         (mat->
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_cols.m_value;
  depth = (other->
          super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
          m_cols.m_value;
  n = 0;
  blocking.super_level3_blocking<double,_double>.m_blockA = (LhsScalar *)0x0;
  local_80 = size;
  blocking.super_level3_blocking<double,_double>.m_blockB = size;
  blocking.super_level3_blocking<double,_double>.m_mc = (Index)size;
  blocking.super_level3_blocking<double,_double>.m_nc = depth;
  internal::evaluateProductBlockingSizesHeuristic<double,double,1,long>
            (&blocking.super_level3_blocking<double,_double>.m_nc,
             (long *)&blocking.super_level3_blocking<double,_double>.m_blockB,(long *)&local_80,1);
  blocking.super_level3_blocking<double,_double>.m_kc =
       (long)blocking.super_level3_blocking<double,_double>.m_blockB *
       blocking.super_level3_blocking<double,_double>.m_nc;
  blocking.m_sizeA =
       blocking.super_level3_blocking<double,_double>.m_nc *
       blocking.super_level3_blocking<double,_double>.m_mc;
  _lhs = (other->
         super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.
         m_data;
  lhsStride = (other->
              super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
              ).super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
              .m_outerStride;
  internal::
  general_matrix_matrix_triangular_product<long,_double,_0,_false,_double,_1,_false,_0,_1,_0>::run
            ((long)size,depth,_lhs,lhsStride,_lhs,lhsStride,
             (mat->
             super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>)
             .super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>
             .
             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>
             .m_data,(mat->
                     super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>
                     ).
                     super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>
                     .m_outerStride,&local_38,(level3_blocking<double,_double> *)&n);
  free((void *)n);
  free(blocking.super_level3_blocking<double,_double>.m_blockA);
  return;
}

Assistant:

static void run(MatrixType& mat, const OtherType& other, const typename MatrixType::Scalar& alpha)
  {
    typedef typename MatrixType::Scalar Scalar;
    typedef internal::blas_traits<OtherType> OtherBlasTraits;
    typedef typename OtherBlasTraits::DirectLinearAccessType ActualOtherType;
    typedef typename internal::remove_all<ActualOtherType>::type _ActualOtherType;
    typename internal::add_const_on_value_type<ActualOtherType>::type actualOther = OtherBlasTraits::extract(other.derived());

    Scalar actualAlpha = alpha * OtherBlasTraits::extractScalarFactor(other.derived());

    enum {
      IsRowMajor = (internal::traits<MatrixType>::Flags&RowMajorBit) ? 1 : 0,
      OtherIsRowMajor = _ActualOtherType::Flags&RowMajorBit ? 1 : 0
    };

    Index size = mat.cols();
    Index depth = actualOther.cols();

    typedef internal::gemm_blocking_space<IsRowMajor ? RowMajor : ColMajor,Scalar,Scalar,
              MatrixType::MaxColsAtCompileTime, MatrixType::MaxColsAtCompileTime, _ActualOtherType::MaxColsAtCompileTime> BlockingType;

    BlockingType blocking(size, size, depth, 1, false);


    internal::general_matrix_matrix_triangular_product<Index,
      Scalar, OtherIsRowMajor ? RowMajor : ColMajor,   OtherBlasTraits::NeedToConjugate  && NumTraits<Scalar>::IsComplex,
      Scalar, OtherIsRowMajor ? ColMajor : RowMajor, (!OtherBlasTraits::NeedToConjugate) && NumTraits<Scalar>::IsComplex,
      IsRowMajor ? RowMajor : ColMajor, UpLo>
      ::run(size, depth,
            &actualOther.coeffRef(0,0), actualOther.outerStride(), &actualOther.coeffRef(0,0), actualOther.outerStride(),
            mat.data(), mat.outerStride(), actualAlpha, blocking);
  }